

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::forward_int8_x86
          (ConvolutionDepthWise_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  int *piVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  undefined4 *puVar8;
  uint *puVar9;
  float *pfVar10;
  Layer *pLVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined4 uVar39;
  undefined1 uVar40;
  undefined1 uVar42;
  undefined1 uVar44;
  undefined1 uVar46;
  undefined8 uVar47;
  Option OVar48;
  undefined1 auVar49 [36];
  undefined1 uVar50;
  int iVar51;
  long lVar52;
  Allocator *pAVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  ulong uVar57;
  ulong uVar58;
  uint uVar59;
  uint uVar60;
  int iVar61;
  ulong uVar62;
  byte bVar63;
  int iVar64;
  float fVar65;
  long lVar66;
  uint uVar67;
  int iVar68;
  undefined1 (*pauVar69) [16];
  undefined1 (*pauVar70) [16];
  Option *pOVar71;
  int iVar72;
  long lVar73;
  _func_int ***ppp_Var74;
  bool bVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar113;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  v4sf one;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  undefined1 local_2f8 [24];
  uint uStack_2e0;
  Allocator *pAStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  uint uStack_2c0;
  undefined1 auStack_2dc [36];
  size_t local_2b8;
  ulong local_2a8;
  _func_int ***local_2a0;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  long local_280;
  Mat local_278;
  Mat local_228;
  long local_1e0;
  ulong local_1d8;
  int local_1cc;
  pointer local_1c8;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  int local_1b0;
  Allocator *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined4 local_190;
  ulong local_188;
  Mat local_178;
  void *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined4 uStack_114;
  int local_110;
  Allocator *local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined4 local_f0;
  ulong local_e8;
  size_type local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar41;
  undefined3 uVar43;
  undefined2 uVar45;
  
  local_178.elempack = bottom_blob->elempack;
  local_178.c = bottom_blob->c;
  if (local_178.elempack == 0) {
    bVar75 = false;
  }
  else {
    bVar75 = ((int)bottom_blob->elemsize << 3) / local_178.elempack == 8;
  }
  iVar61 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar72 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar64 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar51 = (this->super_ConvolutionDepthWise).dilation_h;
  piVar4 = bottom_blob->refcount;
  local_178.data = bottom_blob->data;
  local_178.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_178.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_178.elemsize._0_4_ = (undefined4)bottom_blob->elemsize;
  local_178.elemsize._4_4_ = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_178.allocator = bottom_blob->allocator;
  local_178.dims = bottom_blob->dims;
  local_178.w = bottom_blob->w;
  local_178.h = bottom_blob->h;
  local_178.d = bottom_blob->d;
  local_178.cstep = bottom_blob->cstep;
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + 1;
    UNLOCK();
  }
  if (!bVar75) {
    uVar57 = (long)(local_178.elempack * local_178.c) /
             (long)(this->super_ConvolutionDepthWise).group;
    local_278.cstep = 0;
    local_278.data = (Allocator *)0x0;
    local_278.refcount._0_4_ = 0;
    local_278.refcount._4_4_ = 0;
    local_278.elemsize._0_4_ = 0;
    local_278.elempack = 0;
    local_278.elemsize._4_4_ = (int)local_278.refcount;
    local_278.allocator = (Allocator *)local_278.data;
    local_278.dims = (int)local_278.refcount;
    local_278.w = local_278.refcount._4_4_;
    local_278.h = (int)local_278.elemsize;
    local_278.d = (int)local_278.refcount;
    local_278.c = local_278.elempack;
    Mat::create(&local_278,local_178.elempack * local_178.c,4,(Allocator *)0x0);
    lVar52 = (long)(this->super_ConvolutionDepthWise).group;
    if (0 < lVar52) {
      pvVar5 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
      lVar66 = 0;
      pAVar53 = (Allocator *)local_278.data;
      do {
        if (0 < (int)uVar57) {
          uVar1 = *(undefined4 *)((long)pvVar5 + lVar66 * 4);
          uVar58 = uVar57 & 0xffffffff;
          do {
            *(undefined4 *)&pAVar53->_vptr_Allocator = uVar1;
            pAVar53 = (Allocator *)((long)&pAVar53->_vptr_Allocator + 4);
            uVar67 = (int)uVar58 - 1;
            uVar58 = (ulong)uVar67;
          } while (uVar67 != 0);
        }
        lVar66 = lVar66 + 1;
      } while (lVar66 != lVar52);
    }
    stack0xfffffffffffffd18 = SUB6448(*opt,0x10);
    local_2f8._0_8_ = SUB648(*opt,0);
    local_2f8._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_178,&local_278,(Option *)local_2f8);
    bVar75 = local_178.data == (void *)0x0;
    lVar52 = (long)local_178.c * local_178.cstep;
    piVar4 = (int *)CONCAT44(local_278.refcount._4_4_,(int)local_278.refcount);
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + -1;
      UNLOCK();
      if (*piVar4 == 0) {
        if (local_278.allocator == (Allocator *)0x0) {
          if ((Allocator *)local_278.data != (Allocator *)0x0) {
            free(local_278.data);
          }
        }
        else {
          (*(local_278.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar56 = -100;
    if (bVar75 || lVar52 == 0) goto LAB_00416004;
  }
  local_278.cstep = 0;
  local_278.data = (Allocator *)0x0;
  local_278.refcount._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.elemsize._0_4_ = 0;
  local_278.elempack = 0;
  local_278.elemsize._4_4_ = (int)local_278.refcount;
  local_278.allocator = (Allocator *)local_278.data;
  local_278.dims = (int)local_278.refcount;
  local_278.w = local_278.refcount._4_4_;
  local_278.h = (int)local_278.elemsize;
  local_278.d = (int)local_278.refcount;
  local_278.c = local_278.elempack;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,&local_178,&local_278,opt);
  iVar55 = local_278.c;
  iVar54 = local_278.elempack;
  iVar56 = -100;
  if (((Allocator *)local_278.data == (Allocator *)0x0) ||
     ((long)local_278.c * local_278.cstep == 0)) goto LAB_00415f83;
  uVar58 = (ulong)(uint)local_278.c;
  iVar61 = (~((iVar61 + -1) * iVar64) + local_278.w) / (this->super_ConvolutionDepthWise).stride_w;
  iVar64 = iVar61 + 1;
  uVar57 = (long)(~((iVar72 + -1) * iVar51) + local_278.h) /
           (long)(this->super_ConvolutionDepthWise).stride_h;
  local_298 = uVar57 & 0xffffffff;
  iVar72 = (int)uVar57 + 1;
  uVar59 = local_278.c * local_278.elempack;
  uVar67 = (this->super_ConvolutionDepthWise).group;
  if ((uVar59 == uVar67) &&
     (uVar60 = (this->super_ConvolutionDepthWise).num_output, uVar67 == uVar60)) {
    local_1cc = local_278.w;
    uVar67 = 8;
    if (opt->use_packing_layout == false) {
      uVar67 = 1;
    }
    if ((uVar60 & 7) != 0) {
      uVar67 = 1;
    }
    iVar51 = (this->super_ConvolutionDepthWise).int8_scale_term;
    uVar59 = uVar67 * 4;
    if (100 < iVar51) {
      uVar59 = uVar67;
    }
    Mat::create(top_blob,iVar64,iVar72,(int)uVar60 / (int)uVar67,(ulong)uVar59,uVar67,
                opt->blob_allocator);
    iVar56 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar56 = 0;
      if (iVar54 == 1) {
        iVar72 = (this->super_ConvolutionDepthWise).kernel_w;
        iVar64 = (this->super_ConvolutionDepthWise).kernel_h;
        iVar56 = (this->super_ConvolutionDepthWise).stride_w;
        iVar54 = (this->super_ConvolutionDepthWise).stride_h;
        iVar55 = (this->super_ConvolutionDepthWise).dilation_w;
        iVar68 = (this->super_ConvolutionDepthWise).dilation_h;
        uVar67 = (this->super_ConvolutionDepthWise).activation_type;
        pOVar71 = (Option *)(ulong)uVar67;
        if ((1 < uVar67 || (iVar68 != 1 || iVar55 != 1)) ||
            ((iVar54 != 1 || iVar56 != 1) || (iVar64 != 3 || iVar72 != 3))) {
          pOVar71 = (Option *)(ulong)CONCAT31((int3)(uVar67 >> 8),uVar67 < 2);
          if (((iVar54 == 2 && iVar56 == 2) && uVar67 < 2) &&
              ((iVar64 == 3 && iVar72 == 3) && (iVar55 == 1 && iVar68 == 1))) {
            if (iVar51 < 0x65) {
              local_2f8._0_16_ = ZEXT816(0);
              local_2f8._16_8_ = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar52 = 0;
                do {
                  fVar65 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                   weight_data_int8_scales.data + lVar52 * 4) *
                                 *(float *)((long)(this->super_ConvolutionDepthWise).
                                                  bottom_blob_int8_scales.data + lVar52 * 4));
                  local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar65);
                  if (local_2f8._8_8_ == local_2f8._16_8_) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2f8,
                               (iterator)local_2f8._8_8_,(float *)&local_228);
                  }
                  else {
                    *(float *)local_2f8._8_8_ = fVar65;
                    local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_d8,(vector<float,_std::allocator<float>_> *)local_2f8);
              convdw3x3s2_int8_dequant_sse
                        (&local_278,top_blob,&this->weight_data_tm,
                         &(this->super_ConvolutionDepthWise).bias_data,&local_d8,pOVar71);
            }
            else {
              local_2f8._0_16_ = ZEXT816(0);
              local_2f8._16_8_ = 0;
              if (0 < (this->super_ConvolutionDepthWise).group) {
                lVar52 = 0;
                do {
                  fVar65 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                            weight_data_int8_scales.data + lVar52 * 4);
                  fVar106 = 0.0;
                  if (fVar65 != 0.0) {
                    fVar106 = 1.0 / (fVar65 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                               bottom_blob_int8_scales.data +
                                                        lVar52 * 4));
                  }
                  local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar106);
                  local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                                *(undefined4 *)
                                                 ((long)(this->super_ConvolutionDepthWise).
                                                        top_blob_int8_scales.data + lVar52 * 4));
                  if (local_2f8._8_8_ == local_2f8._16_8_) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2f8,
                               (iterator)local_2f8._8_8_,(float *)&local_228);
                  }
                  else {
                    *(float *)local_2f8._8_8_ = fVar106;
                    local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
                  }
                  if (local_2f8._8_8_ == local_2f8._16_8_) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)local_2f8,
                               (iterator)local_2f8._8_8_,(float *)&local_1c8);
                  }
                  else {
                    *(float *)local_2f8._8_8_ = local_1c8._0_4_;
                    local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
                  }
                  lVar52 = lVar52 + 1;
                } while (lVar52 < (this->super_ConvolutionDepthWise).group);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_c0,(vector<float,_std::allocator<float>_> *)local_2f8);
              convdw3x3s2_int8_requant_sse
                        (&local_278,top_blob,&this->weight_data_tm,
                         &(this->super_ConvolutionDepthWise).bias_data,&local_c0,pOVar71);
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
              local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
            }
            goto joined_r0x00415dd4;
          }
          local_2a8 = CONCAT44(local_2a8._4_4_,iVar64 * iVar72);
          local_e0 = (size_type)(iVar64 * iVar72);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)local_2f8,local_e0,
                     (allocator_type *)&local_228);
          uVar47 = local_2f8._0_8_;
          if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
            iVar72 = (this->super_ConvolutionDepthWise).dilation_h;
            iVar64 = (this->super_ConvolutionDepthWise).dilation_w;
            iVar56 = (this->super_ConvolutionDepthWise).kernel_w;
            iVar54 = 0;
            fVar65 = 0.0;
            iVar55 = 0;
            do {
              if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
                lVar52 = 0;
                do {
                  *(float *)(local_2f8._0_8_ + (iVar55 + lVar52) * 4) = fVar65;
                  fVar65 = (float)((int)fVar65 + (this->super_ConvolutionDepthWise).dilation_w);
                  lVar52 = lVar52 + 1;
                } while ((int)lVar52 < (this->super_ConvolutionDepthWise).kernel_w);
                iVar55 = iVar55 + (int)lVar52;
              }
              fVar65 = (float)((int)fVar65 + (local_1cc * iVar72 - iVar64 * iVar56));
              iVar54 = iVar54 + 1;
            } while (iVar54 < (this->super_ConvolutionDepthWise).kernel_h);
          }
          if (0 < (this->super_ConvolutionDepthWise).group) {
            uVar58 = local_2a8 & 0xffffffff;
            local_1e0 = 0;
            auVar127 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
            uVar57 = 0;
            iVar72 = (int)local_2a8;
            do {
              lVar52 = local_1e0;
              pvVar5 = local_278.data;
              if (-1 < (int)(uint)local_298) {
                lVar73 = local_278.cstep * uVar57;
                lVar66 = CONCAT44(local_278.elemsize._4_4_,(int)local_278.elemsize);
                ppp_Var74 = (_func_int ***)
                            (top_blob->elemsize * uVar57 * top_blob->cstep + (long)top_blob->data);
                local_288 = local_278.w * lVar66;
                pvVar6 = (this->weight_data_tm).data;
                local_1d8 = 0;
                local_2a0 = ppp_Var74;
                local_290 = uVar57;
                do {
                  if (-1 < iVar61) {
                    local_280 = (long)(int)local_1d8;
                    iVar64 = 0;
                    do {
                      fVar65 = 0.0;
                      fVar106 = 0.0;
                      if (0 < iVar72) {
                        uVar62 = 0;
                        iVar56 = 0;
                        do {
                          iVar56 = iVar56 + (int)*(char *)((long)pvVar6 + uVar62 + lVar52) *
                                            (int)*(char *)((long)(_func_int ***)pvVar5 +
                                                          (long)(int)*(pointer)(uVar47 + uVar62 * 4)
                                                          + (this->super_ConvolutionDepthWise).
                                                            stride_h * local_280 * local_288 +
                                                            (long)iVar64 *
                                                            (long)(this->super_ConvolutionDepthWise)
                                                                  .stride_w + lVar73 * lVar66);
                          uVar62 = uVar62 + 1;
                        } while (uVar58 != uVar62);
                        fVar106 = (float)iVar56;
                      }
                      fVar2 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                               weight_data_int8_scales.data + uVar57 * 4);
                      if (fVar2 != 0.0) {
                        fVar65 = 1.0 / (fVar2 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                                 bottom_blob_int8_scales.data +
                                                          uVar57 * 4));
                      }
                      fVar65 = fVar65 * fVar106;
                      if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                        fVar65 = fVar65 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                           bias_data.data + uVar57 * 4);
                      }
                      auVar76 = ZEXT416((uint)fVar65);
                      fVar106 = fVar65;
                      switch((this->super_ConvolutionDepthWise).activation_type) {
                      case 1:
                        auVar76 = vmaxss_avx(auVar76,ZEXT416(0));
                        fVar106 = auVar76._0_4_;
                        break;
                      case 2:
                        uVar13 = vcmpss_avx512f(auVar76,ZEXT416(0),0xe);
                        bVar75 = (bool)((byte)uVar13 & 1);
                        fVar106 = (float)((uint)bVar75 * 0x3f800000 +
                                         (uint)!bVar75 *
                                         *(this->super_ConvolutionDepthWise).activation_params.data)
                                  * fVar65;
                        break;
                      case 3:
                        puVar9 = (uint *)(this->super_ConvolutionDepthWise).activation_params.data;
                        fVar65 = (float)puVar9[1];
                        auVar76 = vmaxss_avx(auVar76,ZEXT416(*puVar9));
                        fVar106 = auVar76._0_4_;
                        if (fVar65 < auVar76._0_4_) {
                          fVar106 = fVar65;
                        }
                        break;
                      case 4:
                        auVar76 = vminss_avx(auVar76,SUB6416(ZEXT464(0x42b0c0a5),0));
                        uVar13 = vcmpss_avx512f(auVar76,ZEXT416(0xc2b0c0a5),1);
                        bVar75 = (bool)((byte)uVar13 & 1);
                        fVar65 = expf((float)((uint)bVar75 * 0x42b0c0a5 +
                                             (uint)!bVar75 * (auVar76._0_4_ ^ auVar127._0_4_)));
                        auVar127 = ZEXT1664(CONCAT412(0x80000000,
                                                      CONCAT48(0x80000000,0x8000000080000000)));
                        uVar57 = local_290;
                        iVar72 = (int)local_2a8;
                        fVar106 = 1.0 / (fVar65 + 1.0);
                        break;
                      case 5:
                        fVar106 = expf(fVar65);
                        fVar106 = logf(fVar106 + 1.0);
                        fVar106 = tanhf(fVar106);
                        auVar127 = ZEXT1664(CONCAT412(0x80000000,
                                                      CONCAT48(0x80000000,0x8000000080000000)));
                        uVar57 = local_290;
                        iVar72 = (int)local_2a8;
                        fVar106 = fVar106 * fVar65;
                        break;
                      case 6:
                        pfVar10 = (float *)(this->super_ConvolutionDepthWise).activation_params.data
                        ;
                        fVar2 = *pfVar10;
                        fVar3 = pfVar10[1];
                        fVar113 = (float)((uint)fVar3 ^ auVar127._0_4_) / fVar2;
                        fVar106 = 0.0;
                        if ((fVar113 <= fVar65) &&
                           (fVar106 = fVar65, fVar65 <= fVar113 + 1.0 / fVar2)) {
                          auVar76 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar76,
                                                    ZEXT416((uint)fVar3));
                          fVar106 = auVar76._0_4_ * fVar65;
                        }
                      }
                      if (iVar51 < 0x65) {
                        *(float *)ppp_Var74 = fVar106;
                        ppp_Var74 = (_func_int ***)((long)ppp_Var74 + 4);
                      }
                      else {
                        fVar106 = fVar106 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                             top_blob_int8_scales.data + uVar57 * 4)
                        ;
                        auVar76._8_4_ = 0x3effffff;
                        auVar76._0_8_ = 0x3effffff3effffff;
                        auVar76._12_4_ = 0x3effffff;
                        auVar76 = vpternlogd_avx512vl(auVar76,ZEXT416((uint)fVar106),auVar127._0_16_
                                                      ,0xf8);
                        auVar76 = ZEXT416((uint)(fVar106 + auVar76._0_4_));
                        auVar76 = vroundss_avx(auVar76,auVar76,0xb);
                        iVar56 = (int)auVar76._0_4_;
                        if (iVar56 < -0x7e) {
                          iVar56 = -0x7f;
                        }
                        uVar50 = (undefined1)iVar56;
                        if (0x7e < iVar56) {
                          uVar50 = 0x7f;
                        }
                        *(undefined1 *)local_2a0 = uVar50;
                        local_2a0 = (_func_int ***)((long)local_2a0 + 1);
                      }
                      bVar75 = iVar64 != iVar61;
                      iVar64 = iVar64 + 1;
                    } while (bVar75);
                  }
                  iVar64 = (int)local_1d8;
                  local_1d8 = (ulong)(iVar64 + 1);
                } while (iVar64 != (uint)local_298);
              }
              uVar57 = uVar57 + 1;
              local_1e0 = local_1e0 + local_e0;
            } while ((long)uVar57 < (long)(this->super_ConvolutionDepthWise).group);
          }
          if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
          }
        }
        else {
          if (iVar51 < 0x65) {
            local_2f8._0_16_ = ZEXT816(0);
            local_2f8._16_8_ = 0;
            if (0 < (this->super_ConvolutionDepthWise).group) {
              lVar52 = 0;
              do {
                fVar65 = 1.0 / (*(float *)((long)(this->super_ConvolutionDepthWise).
                                                 weight_data_int8_scales.data + lVar52 * 4) *
                               *(float *)((long)(this->super_ConvolutionDepthWise).
                                                bottom_blob_int8_scales.data + lVar52 * 4));
                local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar65);
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_228);
                }
                else {
                  *(float *)local_2f8._8_8_ = fVar65;
                  local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
                }
                lVar52 = lVar52 + 1;
              } while (lVar52 < (this->super_ConvolutionDepthWise).group);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)local_2f8);
            convdw3x3s1_int8_dequant_sse
                      (&local_278,top_blob,&this->weight_data_tm,
                       &(this->super_ConvolutionDepthWise).bias_data,&local_a8,pOVar71);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_2f8._0_16_ = ZEXT816(0);
            local_2f8._16_8_ = 0;
            if (0 < (this->super_ConvolutionDepthWise).group) {
              lVar52 = 0;
              do {
                fVar65 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales
                                          .data + lVar52 * 4);
                fVar106 = 0.0;
                if (fVar65 != 0.0) {
                  fVar106 = 1.0 / (fVar65 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                             bottom_blob_int8_scales.data +
                                                      lVar52 * 4));
                }
                local_228.data = (void *)CONCAT44(local_228.data._4_4_,fVar106);
                local_1c8 = (pointer)CONCAT44(local_1c8._4_4_,
                                              *(undefined4 *)
                                               ((long)(this->super_ConvolutionDepthWise).
                                                      top_blob_int8_scales.data + lVar52 * 4));
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_228);
                }
                else {
                  *(float *)local_2f8._8_8_ = fVar106;
                  local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
                }
                if (local_2f8._8_8_ == local_2f8._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_2f8,
                             (iterator)local_2f8._8_8_,(float *)&local_1c8);
                }
                else {
                  *(float *)local_2f8._8_8_ = local_1c8._0_4_;
                  local_2f8._8_8_ = (float *)(local_2f8._8_8_ + 4);
                }
                lVar52 = lVar52 + 1;
              } while (lVar52 < (this->super_ConvolutionDepthWise).group);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)local_2f8);
            convdw3x3s1_int8_requant_sse
                      (&local_278,top_blob,&this->weight_data_tm,
                       &(this->super_ConvolutionDepthWise).bias_data,&local_90,pOVar71);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
joined_r0x00415dd4:
          if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
          }
          pLVar11 = this->activation;
          if (pLVar11 != (Layer *)0x0) {
            (*pLVar11->_vptr_Layer[9])(pLVar11,top_blob,opt);
            iVar56 = 0;
            goto LAB_00415f83;
          }
        }
        iVar56 = 0;
      }
      else if (iVar54 == 8) {
        uVar57 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                 (long)(this->super_ConvolutionDepthWise).kernel_w;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_2f8,uVar57,
                   (allocator_type *)&local_228);
        if (0 < (this->super_ConvolutionDepthWise).kernel_h) {
          iVar72 = (this->super_ConvolutionDepthWise).dilation_h;
          iVar64 = (this->super_ConvolutionDepthWise).dilation_w;
          iVar56 = (this->super_ConvolutionDepthWise).kernel_w;
          iVar54 = 0;
          fVar65 = 0.0;
          iVar68 = 0;
          do {
            if (0 < (this->super_ConvolutionDepthWise).kernel_w) {
              lVar52 = 0;
              do {
                *(float *)(local_2f8._0_8_ + (iVar54 + lVar52) * 4) = fVar65;
                fVar65 = (float)((int)fVar65 + (this->super_ConvolutionDepthWise).dilation_w);
                lVar52 = lVar52 + 1;
              } while ((int)lVar52 < (this->super_ConvolutionDepthWise).kernel_w);
              iVar54 = iVar54 + (int)lVar52;
            }
            fVar65 = (float)((int)fVar65 + (iVar72 * local_1cc - iVar64 * iVar56));
            iVar68 = iVar68 + 1;
          } while (iVar68 < (this->super_ConvolutionDepthWise).kernel_h);
        }
        if (0 < iVar55) {
          iVar72 = (int)uVar57 * 8;
          local_1e0 = CONCAT44(local_1e0._4_4_,iVar72);
          local_290 = 0;
          auVar107._8_4_ = 0x80000000;
          auVar107._0_8_ = 0x8000000080000000;
          auVar107._12_4_ = 0x80000000;
          auVar108._8_4_ = 0x3f000000;
          auVar108._0_8_ = 0x3f0000003f000000;
          auVar108._12_4_ = 0x3f000000;
          auVar76 = vpbroadcastw_avx512vl(ZEXT216(0x7f));
          auVar77 = vpbroadcastw_avx512vl(ZEXT216(0xff81));
          auVar128._8_4_ = 0x42b0c0a5;
          auVar128._0_8_ = 0x42b0c0a542b0c0a5;
          auVar128._12_4_ = 0x42b0c0a5;
          auVar129._8_4_ = 0xc2b0c0a5;
          auVar129._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar129._12_4_ = 0xc2b0c0a5;
          auVar130._8_4_ = 0x3f000000;
          auVar130._0_8_ = 0x3f0000003f000000;
          auVar130._12_4_ = 0x3f000000;
          auVar131._8_4_ = 0x3fb8aa3b;
          auVar131._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar131._12_4_ = 0x3fb8aa3b;
          auVar132._8_4_ = 0x3f800000;
          auVar132._0_8_ = 0x3f8000003f800000;
          auVar132._12_4_ = 0x3f800000;
          auVar133._8_4_ = 0x3f318000;
          auVar133._0_8_ = 0x3f3180003f318000;
          auVar133._12_4_ = 0x3f318000;
          auVar140._8_4_ = 0x39506967;
          auVar140._0_8_ = 0x3950696739506967;
          auVar140._12_4_ = 0x39506967;
          auVar141._8_4_ = 0x3ab743ce;
          auVar141._0_8_ = 0x3ab743ce3ab743ce;
          auVar141._12_4_ = 0x3ab743ce;
          auVar142._8_4_ = 0x3c088908;
          auVar142._0_8_ = 0x3c0889083c088908;
          auVar142._12_4_ = 0x3c088908;
          auVar143._8_4_ = 0x3d2aa9c1;
          auVar143._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar143._12_4_ = 0x3d2aa9c1;
          auVar78 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar79 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          auVar80 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar82 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
          auVar83 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
          auVar84 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
          auVar85 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
          local_2a8 = 0;
          auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
          do {
            if (-1 < (int)(uint)local_298) {
              local_2a0 = (_func_int ***)
                          ((long)(_func_int ***)local_278.data +
                          local_278.cstep * local_2a8 *
                          CONCAT44(local_278.elemsize._4_4_,(int)local_278.elemsize));
              pauVar69 = (undefined1 (*) [16])
                         (top_blob->elemsize * local_2a8 * top_blob->cstep + (long)top_blob->data);
              local_280 = (long)local_278.w *
                          CONCAT44(local_278.elemsize._4_4_,(int)local_278.elemsize);
              pvVar5 = (this->weight_data_tm).data;
              pauVar70 = pauVar69;
              uVar62 = 0;
              do {
                local_288 = uVar62;
                iVar64 = (int)local_288;
                if (-1 < iVar61) {
                  iVar56 = 0;
                  do {
                    auVar88 = in_ZMM20._0_16_;
                    auVar89 = in_ZMM21._0_16_;
                    if ((int)uVar57 < 1) {
                      auVar89 = vxorps_avx512vl(auVar89,auVar89);
                      auVar88 = vxorps_avx512vl(auVar88,auVar88);
                    }
                    else {
                      auVar88 = vpxord_avx512vl(auVar88,auVar88);
                      uVar62 = 0;
                      auVar89 = vpxord_avx512vl(auVar89,auVar89);
                      do {
                        auVar105._8_8_ = 0;
                        auVar105._0_8_ =
                             *(ulong *)((long)(local_2a0 +
                                              (int)*(pointer)(local_2f8._0_8_ + uVar62 * 4)) +
                                       (long)(this->super_ConvolutionDepthWise).stride_h *
                                       (long)iVar64 * local_280 +
                                       (long)((this->super_ConvolutionDepthWise).stride_w * iVar56 *
                                             8));
                        auVar92 = vpcmpgtb_avx((undefined1  [16])0x0,auVar105);
                        auVar90 = vpunpcklbw_avx(auVar105,auVar92);
                        auVar91._8_8_ = 0;
                        auVar91._0_8_ = *(ulong *)((long)pvVar5 + uVar62 * 8 + (long)(int)local_290)
                        ;
                        auVar92 = vpcmpgtb_avx((undefined1  [16])0x0,auVar91);
                        auVar92 = vpunpcklbw_avx(auVar91,auVar92);
                        auVar105 = vpmullw_avx(auVar92,auVar90);
                        auVar92 = vpmulhw_avx(auVar90,auVar92);
                        auVar90 = vpunpcklwd_avx(auVar105,auVar92);
                        auVar88 = vpaddd_avx512vl(auVar88,auVar90);
                        auVar92 = vpunpckhwd_avx(auVar105,auVar92);
                        auVar89 = vpaddd_avx512vl(auVar89,auVar92);
                        uVar62 = uVar62 + 1;
                      } while ((uVar57 & 0xffffffff) != uVar62);
                      auVar88 = vcvtdq2ps_avx512vl(auVar88);
                      auVar89 = vcvtdq2ps_avx512vl(auVar89);
                    }
                    pvVar6 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                    pvVar7 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                    auVar92 = *(undefined1 (*) [16])((long)pvVar6 + local_2a8 * 0x20);
                    auVar105 = *(undefined1 (*) [16])((long)pvVar6 + local_2a8 * 0x20 + 0x10);
                    auVar90 = vmulps_avx512vl(auVar92,*(undefined1 (*) [16])
                                                       ((long)pvVar7 + local_2a8 * 0x20));
                    auVar90 = vrcpps_avx(auVar90);
                    auVar91 = vmulps_avx512vl(auVar105,*(undefined1 (*) [16])
                                                        ((long)pvVar7 + local_2a8 * 0x20 + 0x10));
                    auVar91 = vrcpps_avx(auVar91);
                    uVar62 = vcmpps_avx512vl(auVar92,(undefined1  [16])0x0,4);
                    uVar12 = vcmpps_avx512vl(auVar105,(undefined1  [16])0x0,4);
                    auVar92._4_4_ = (uint)((byte)(uVar62 >> 1) & 1) * auVar90._4_4_;
                    auVar92._0_4_ = (uint)((byte)uVar62 & 1) * auVar90._0_4_;
                    auVar92._8_4_ = (uint)((byte)(uVar62 >> 2) & 1) * auVar90._8_4_;
                    auVar92._12_4_ = (uint)((byte)(uVar62 >> 3) & 1) * auVar90._12_4_;
                    auVar92 = vmulps_avx512vl(auVar92,auVar88);
                    auVar88._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar91._4_4_;
                    auVar88._0_4_ = (uint)((byte)uVar12 & 1) * auVar91._0_4_;
                    auVar88._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar91._8_4_;
                    auVar88._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar91._12_4_;
                    auVar88 = vmulps_avx512vl(auVar88,auVar89);
                    if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                      pvVar6 = (this->super_ConvolutionDepthWise).bias_data.data;
                      auVar92 = vaddps_avx512vl(auVar92,*(undefined1 (*) [16])
                                                         ((long)pvVar6 + local_2a8 * 0x20));
                      auVar88 = vaddps_avx512vl(auVar88,*(undefined1 (*) [16])
                                                         ((long)pvVar6 + local_2a8 * 0x20 + 0x10));
                    }
                    in_ZMM21 = ZEXT1664(auVar88);
                    in_ZMM20 = ZEXT1664(auVar92);
                    iVar54 = (this->super_ConvolutionDepthWise).activation_type + -1;
                    switch(iVar54) {
                    case 0:
                      auVar89 = vmaxps_avx512vl(auVar92,(undefined1  [16])0x0);
                      in_ZMM20 = ZEXT1664(auVar89);
                      break;
                    case 1:
                      auVar89 = vmaxps_avx512vl(auVar92,(undefined1  [16])0x0);
                      auVar92 = vminps_avx512vl(auVar92,(undefined1  [16])0x0);
                      uVar1 = *(this->super_ConvolutionDepthWise).activation_params.data;
                      auVar25._4_4_ = uVar1;
                      auVar25._0_4_ = uVar1;
                      auVar25._8_4_ = uVar1;
                      auVar25._12_4_ = uVar1;
                      auVar89 = vfmadd132ps_avx512vl(auVar92,auVar89,auVar25);
                      in_ZMM20 = ZEXT1664(auVar89);
                      break;
                    case 2:
                      puVar8 = (undefined4 *)
                               (this->super_ConvolutionDepthWise).activation_params.data;
                      uVar1 = *puVar8;
                      auVar23._4_4_ = uVar1;
                      auVar23._0_4_ = uVar1;
                      auVar23._8_4_ = uVar1;
                      auVar23._12_4_ = uVar1;
                      auVar89 = vmaxps_avx512vl(auVar92,auVar23);
                      uVar1 = puVar8[1];
                      auVar24._4_4_ = uVar1;
                      auVar24._0_4_ = uVar1;
                      auVar24._8_4_ = uVar1;
                      auVar24._12_4_ = uVar1;
                      auVar89 = vminps_avx512vl(auVar89,auVar24);
                      in_ZMM20 = ZEXT1664(auVar89);
                      break;
                    case 3:
                      auVar89 = vxorps_avx512vl(auVar92,auVar107);
                      auVar89 = vminps_avx(auVar89,auVar128);
                      auVar92 = vmaxps_avx(auVar89,auVar129);
                      auVar105 = vfmadd231ps_fma(auVar130,auVar92,auVar131);
                      auVar136._0_4_ = (int)auVar105._0_4_;
                      auVar136._4_4_ = (int)auVar105._4_4_;
                      auVar136._8_4_ = (int)auVar105._8_4_;
                      auVar136._12_4_ = (int)auVar105._12_4_;
                      auVar89 = vcvtdq2ps_avx(auVar136);
                      uVar62 = vcmpps_avx512vl(auVar105,auVar89,1);
                      auVar105 = vsubps_avx512vl(auVar89,auVar132);
                      bVar75 = (bool)((byte)uVar62 & 1);
                      auVar98._0_4_ =
                           (float)((uint)bVar75 * auVar105._0_4_ | (uint)!bVar75 * auVar89._0_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 1) & 1);
                      auVar98._4_4_ =
                           (float)((uint)bVar75 * auVar105._4_4_ | (uint)!bVar75 * auVar89._4_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 2) & 1);
                      auVar98._8_4_ =
                           (float)((uint)bVar75 * auVar105._8_4_ | (uint)!bVar75 * auVar89._8_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 3) & 1);
                      auVar98._12_4_ =
                           (float)((uint)bVar75 * auVar105._12_4_ | (uint)!bVar75 * auVar89._12_4_);
                      auVar89 = vfmsub231ps_fma(auVar92,auVar98,auVar133);
                      auVar22._8_4_ = 0x395e8083;
                      auVar22._0_8_ = 0x395e8083395e8083;
                      auVar22._12_4_ = 0x395e8083;
                      auVar89 = vfmsub231ps_avx512vl(auVar89,auVar98,auVar22);
                      auVar118._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                      auVar118._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                      auVar118._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                      auVar118._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                      auVar92 = vfmadd213ps_avx512vl(auVar140,auVar89,auVar141);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar142);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar143);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar78);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar130);
                      auVar89 = vfmadd213ps_avx512vl(auVar92,auVar118,auVar89);
                      auVar89 = vaddps_avx512vl(auVar89,auVar132);
                      auVar119._0_4_ = (int)auVar98._0_4_;
                      auVar119._4_4_ = (int)auVar98._4_4_;
                      auVar119._8_4_ = (int)auVar98._8_4_;
                      auVar119._12_4_ = (int)auVar98._12_4_;
                      auVar92 = vpslld_avx(auVar119,0x17);
                      auVar92 = vpaddd_avx512vl(auVar92,auVar79);
                      auVar89 = vfmadd213ps_fma(auVar92,auVar89,auVar132);
                      auVar89 = vdivps_avx512vl(auVar132,auVar89);
                      in_ZMM20 = ZEXT1664(auVar89);
                      break;
                    case 4:
                      auVar89 = vminps_avx512vl(auVar92,auVar128);
                      auVar105 = vmaxps_avx(auVar89,auVar129);
                      auVar90 = vfmadd213ps_fma(auVar131,auVar105,auVar130);
                      auVar134._0_4_ = (int)auVar90._0_4_;
                      auVar134._4_4_ = (int)auVar90._4_4_;
                      auVar134._8_4_ = (int)auVar90._8_4_;
                      auVar134._12_4_ = (int)auVar90._12_4_;
                      auVar89 = vcvtdq2ps_avx(auVar134);
                      uVar62 = vcmpps_avx512vl(auVar90,auVar89,1);
                      auVar90 = vsubps_avx512vl(auVar89,auVar132);
                      bVar75 = (bool)((byte)uVar62 & 1);
                      auVar93._0_4_ =
                           (float)((uint)bVar75 * auVar90._0_4_ | (uint)!bVar75 * auVar89._0_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 1) & 1);
                      auVar93._4_4_ =
                           (float)((uint)bVar75 * auVar90._4_4_ | (uint)!bVar75 * auVar89._4_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 2) & 1);
                      auVar93._8_4_ =
                           (float)((uint)bVar75 * auVar90._8_4_ | (uint)!bVar75 * auVar89._8_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 3) & 1);
                      auVar93._12_4_ =
                           (float)((uint)bVar75 * auVar90._12_4_ | (uint)!bVar75 * auVar89._12_4_);
                      auVar89 = vfmsub231ps_fma(auVar105,auVar93,auVar133);
                      auVar89 = vfnmsub231ps_avx512vl(auVar89,auVar93,auVar80);
                      auVar114._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                      auVar114._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                      auVar114._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                      auVar114._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                      auVar105 = vfmadd213ps_avx512vl(auVar140,auVar89,auVar141);
                      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar89,auVar142);
                      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar89,auVar143);
                      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar89,auVar78);
                      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar89,auVar130);
                      auVar89 = vfmadd213ps_avx512vl(auVar105,auVar114,auVar89);
                      auVar89 = vaddps_avx512vl(auVar89,auVar132);
                      auVar115._0_4_ = (int)auVar93._0_4_;
                      auVar115._4_4_ = (int)auVar93._4_4_;
                      auVar115._8_4_ = (int)auVar93._8_4_;
                      auVar115._12_4_ = (int)auVar93._12_4_;
                      auVar105 = vpslld_avx(auVar115,0x17);
                      auVar105 = vpaddd_avx512vl(auVar105,auVar79);
                      auVar89 = vfmadd213ps_fma(auVar105,auVar89,auVar132);
                      uVar62 = vcmpps_avx512vl(auVar89,(undefined1  [16])0x0,2);
                      auVar14._8_4_ = 0x800000;
                      auVar14._0_8_ = 0x80000000800000;
                      auVar14._12_4_ = 0x800000;
                      auVar89 = vmaxps_avx512vl(auVar89,auVar14);
                      auVar90 = vpsrld_avx(auVar89,0x17);
                      auVar15._8_4_ = 0x807fffff;
                      auVar15._0_8_ = 0x807fffff807fffff;
                      auVar15._12_4_ = 0x807fffff;
                      auVar89 = vpternlogd_avx512vl(auVar89,auVar108,auVar15,0xec);
                      auVar16._8_4_ = 0x3f3504f3;
                      auVar16._0_8_ = 0x3f3504f33f3504f3;
                      auVar16._12_4_ = 0x3f3504f3;
                      uVar12 = vcmpps_avx512vl(auVar89,auVar16,1);
                      auVar17._8_4_ = 0xbf800000;
                      auVar17._0_8_ = 0xbf800000bf800000;
                      auVar17._12_4_ = 0xbf800000;
                      auVar105 = vaddps_avx512vl(auVar89,auVar17);
                      auVar89 = vaddps_avx512vl(auVar105,auVar89);
                      bVar75 = (bool)((byte)uVar12 & 1);
                      auVar94._0_4_ =
                           (float)((uint)bVar75 * auVar89._0_4_ | (uint)!bVar75 * auVar105._0_4_);
                      bVar75 = (bool)((byte)(uVar12 >> 1) & 1);
                      auVar94._4_4_ =
                           (float)((uint)bVar75 * auVar89._4_4_ | (uint)!bVar75 * auVar105._4_4_);
                      bVar75 = (bool)((byte)(uVar12 >> 2) & 1);
                      auVar94._8_4_ =
                           (float)((uint)bVar75 * auVar89._8_4_ | (uint)!bVar75 * auVar105._8_4_);
                      bVar75 = (bool)((byte)(uVar12 >> 3) & 1);
                      auVar94._12_4_ =
                           (float)((uint)bVar75 * auVar89._12_4_ | (uint)!bVar75 * auVar105._12_4_);
                      auVar109._0_4_ = auVar94._0_4_ * auVar94._0_4_;
                      auVar109._4_4_ = auVar94._4_4_ * auVar94._4_4_;
                      auVar109._8_4_ = auVar94._8_4_ * auVar94._8_4_;
                      auVar109._12_4_ = auVar94._12_4_ * auVar94._12_4_;
                      auVar18._8_4_ = 0xbdebd1b8;
                      auVar18._0_8_ = 0xbdebd1b8bdebd1b8;
                      auVar18._12_4_ = 0xbdebd1b8;
                      auVar89 = vfmadd213ps_avx512vl(auVar81,auVar94,auVar18);
                      auVar19._8_4_ = 0x3def251a;
                      auVar19._0_8_ = 0x3def251a3def251a;
                      auVar19._12_4_ = 0x3def251a;
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar94,auVar19);
                      auVar20._8_4_ = 0xbdfe5d4f;
                      auVar20._0_8_ = 0xbdfe5d4fbdfe5d4f;
                      auVar20._12_4_ = 0xbdfe5d4f;
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar94,auVar20);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar94,auVar82);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar94,auVar83);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar94,auVar84);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar94,auVar85);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar94,auVar86);
                      auVar105 = vmulps_avx512vl(auVar109,auVar94);
                      auVar105 = vmulps_avx512vl(auVar105,auVar89);
                      auVar21._8_4_ = 0xffffff82;
                      auVar21._0_8_ = 0xffffff82ffffff82;
                      auVar21._12_4_ = 0xffffff82;
                      auVar89 = vpaddd_avx512vl(auVar90,auVar21);
                      auVar89 = vcvtdq2ps_avx(auVar89);
                      auVar90 = vsubps_avx512vl(auVar89,auVar132);
                      bVar75 = (bool)((byte)uVar12 & 1);
                      auVar95._0_4_ = (uint)bVar75 * auVar90._0_4_ | (uint)!bVar75 * auVar89._0_4_;
                      bVar75 = (bool)((byte)(uVar12 >> 1) & 1);
                      auVar95._4_4_ = (uint)bVar75 * auVar90._4_4_ | (uint)!bVar75 * auVar89._4_4_;
                      bVar75 = (bool)((byte)(uVar12 >> 2) & 1);
                      auVar95._8_4_ = (uint)bVar75 * auVar90._8_4_ | (uint)!bVar75 * auVar89._8_4_;
                      bVar75 = (bool)((byte)(uVar12 >> 3) & 1);
                      auVar95._12_4_ =
                           (uint)bVar75 * auVar90._12_4_ | (uint)!bVar75 * auVar89._12_4_;
                      auVar89 = vfmadd231ps_avx512vl(auVar105,auVar95,auVar80);
                      auVar89 = vfmsub231ps_avx512vl(auVar89,auVar130,auVar109);
                      auVar89 = vsubps_avx512vl(auVar89,auVar94);
                      auVar89 = vfnmadd231ps_fma(auVar89,auVar133,auVar95);
                      auVar105 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      bVar75 = (bool)((byte)uVar62 & 1);
                      auVar96._0_4_ =
                           (uint)bVar75 * auVar105._0_4_ |
                           (uint)!bVar75 * (int)(auVar89._0_4_ + auVar89._0_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 1) & 1);
                      auVar96._4_4_ =
                           (uint)bVar75 * auVar105._4_4_ |
                           (uint)!bVar75 * (int)(auVar89._4_4_ + auVar89._4_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 2) & 1);
                      auVar96._8_4_ =
                           (uint)bVar75 * auVar105._8_4_ |
                           (uint)!bVar75 * (int)(auVar89._8_4_ + auVar89._8_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 3) & 1);
                      auVar96._12_4_ =
                           (uint)bVar75 * auVar105._12_4_ |
                           (uint)!bVar75 * (int)(auVar89._12_4_ + auVar89._12_4_);
                      auVar89 = vminps_avx(auVar96,auVar128);
                      auVar105 = vmaxps_avx(auVar89,auVar129);
                      auVar90 = vfmadd213ps_fma(auVar131,auVar105,auVar130);
                      auVar135._0_4_ = (int)auVar90._0_4_;
                      auVar135._4_4_ = (int)auVar90._4_4_;
                      auVar135._8_4_ = (int)auVar90._8_4_;
                      auVar135._12_4_ = (int)auVar90._12_4_;
                      auVar89 = vcvtdq2ps_avx(auVar135);
                      uVar62 = vcmpps_avx512vl(auVar90,auVar89,1);
                      auVar90 = vsubps_avx512vl(auVar89,auVar132);
                      bVar75 = (bool)((byte)uVar62 & 1);
                      auVar97._0_4_ =
                           (float)((uint)bVar75 * auVar90._0_4_ | (uint)!bVar75 * auVar89._0_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 1) & 1);
                      auVar97._4_4_ =
                           (float)((uint)bVar75 * auVar90._4_4_ | (uint)!bVar75 * auVar89._4_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 2) & 1);
                      auVar97._8_4_ =
                           (float)((uint)bVar75 * auVar90._8_4_ | (uint)!bVar75 * auVar89._8_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 3) & 1);
                      auVar97._12_4_ =
                           (float)((uint)bVar75 * auVar90._12_4_ | (uint)!bVar75 * auVar89._12_4_);
                      auVar89 = vfmsub231ps_fma(auVar105,auVar97,auVar133);
                      auVar89 = vfnmsub231ps_avx512vl(auVar89,auVar97,auVar80);
                      auVar116._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                      auVar116._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                      auVar116._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                      auVar116._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                      auVar105 = vfmadd213ps_avx512vl(auVar140,auVar89,auVar141);
                      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar89,auVar142);
                      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar89,auVar143);
                      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar89,auVar78);
                      auVar105 = vfmadd213ps_avx512vl(auVar105,auVar89,auVar130);
                      auVar89 = vfmadd213ps_avx512vl(auVar105,auVar116,auVar89);
                      auVar89 = vaddps_avx512vl(auVar89,auVar132);
                      auVar117._0_4_ = (int)auVar97._0_4_;
                      auVar117._4_4_ = (int)auVar97._4_4_;
                      auVar117._8_4_ = (int)auVar97._8_4_;
                      auVar117._12_4_ = (int)auVar97._12_4_;
                      auVar105 = vpslld_avx(auVar117,0x17);
                      auVar105 = vpaddd_avx512vl(auVar105,auVar79);
                      auVar89 = vfmadd213ps_fma(auVar105,auVar89,auVar132);
                      auVar89 = vdivps_avx512vl(auVar87,auVar89);
                      auVar89 = vfmsub231ps_avx512vl(auVar92,auVar92,auVar89);
                      in_ZMM20 = ZEXT1664(auVar89);
                      break;
                    case 5:
                      puVar8 = (undefined4 *)
                               (this->super_ConvolutionDepthWise).activation_params.data;
                      uVar1 = *puVar8;
                      auVar90._4_4_ = uVar1;
                      auVar90._0_4_ = uVar1;
                      auVar90._8_4_ = uVar1;
                      auVar90._12_4_ = uVar1;
                      uVar1 = puVar8[1];
                      auVar89._4_4_ = uVar1;
                      auVar89._0_4_ = uVar1;
                      auVar89._8_4_ = uVar1;
                      auVar89._12_4_ = uVar1;
                      auVar89 = vfmadd213ps_avx512vl(auVar90,auVar92,auVar89);
                      auVar89 = vmaxps_avx(auVar89,(undefined1  [16])0x0);
                      auVar89 = vminps_avx(auVar132,auVar89);
                      auVar89 = vmulps_avx512vl(auVar89,auVar92);
                      in_ZMM20 = ZEXT1664(auVar89);
                    }
                    switch(iVar54) {
                    case 0:
                      auVar88 = vmaxps_avx512vl(auVar88,(undefined1  [16])0x0);
                      in_ZMM21 = ZEXT1664(auVar88);
                      break;
                    case 1:
                      auVar89 = vmaxps_avx512vl(auVar88,(undefined1  [16])0x0);
                      auVar88 = vminps_avx512vl(auVar88,(undefined1  [16])0x0);
                      uVar1 = *(this->super_ConvolutionDepthWise).activation_params.data;
                      auVar38._4_4_ = uVar1;
                      auVar38._0_4_ = uVar1;
                      auVar38._8_4_ = uVar1;
                      auVar38._12_4_ = uVar1;
                      auVar88 = vfmadd132ps_avx512vl(auVar88,auVar89,auVar38);
                      in_ZMM21 = ZEXT1664(auVar88);
                      break;
                    case 2:
                      puVar8 = (undefined4 *)
                               (this->super_ConvolutionDepthWise).activation_params.data;
                      uVar1 = *puVar8;
                      auVar36._4_4_ = uVar1;
                      auVar36._0_4_ = uVar1;
                      auVar36._8_4_ = uVar1;
                      auVar36._12_4_ = uVar1;
                      auVar88 = vmaxps_avx512vl(auVar88,auVar36);
                      uVar1 = puVar8[1];
                      auVar37._4_4_ = uVar1;
                      auVar37._0_4_ = uVar1;
                      auVar37._8_4_ = uVar1;
                      auVar37._12_4_ = uVar1;
                      auVar88 = vminps_avx512vl(auVar88,auVar37);
                      in_ZMM21 = ZEXT1664(auVar88);
                      break;
                    case 3:
                      auVar88 = vxorps_avx512vl(auVar88,auVar107);
                      auVar88 = vminps_avx(auVar88,auVar128);
                      auVar89 = vmaxps_avx(auVar88,auVar129);
                      auVar92 = vfmadd231ps_fma(auVar130,auVar89,auVar131);
                      auVar139._0_4_ = (int)auVar92._0_4_;
                      auVar139._4_4_ = (int)auVar92._4_4_;
                      auVar139._8_4_ = (int)auVar92._8_4_;
                      auVar139._12_4_ = (int)auVar92._12_4_;
                      auVar88 = vcvtdq2ps_avx(auVar139);
                      uVar62 = vcmpps_avx512vl(auVar92,auVar88,1);
                      auVar92 = vsubps_avx512vl(auVar88,auVar132);
                      bVar75 = (bool)((byte)uVar62 & 1);
                      auVar104._0_4_ =
                           (float)((uint)bVar75 * auVar92._0_4_ | (uint)!bVar75 * auVar88._0_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 1) & 1);
                      auVar104._4_4_ =
                           (float)((uint)bVar75 * auVar92._4_4_ | (uint)!bVar75 * auVar88._4_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 2) & 1);
                      auVar104._8_4_ =
                           (float)((uint)bVar75 * auVar92._8_4_ | (uint)!bVar75 * auVar88._8_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 3) & 1);
                      auVar104._12_4_ =
                           (float)((uint)bVar75 * auVar92._12_4_ | (uint)!bVar75 * auVar88._12_4_);
                      auVar88 = vfmsub231ps_fma(auVar89,auVar104,auVar133);
                      auVar35._8_4_ = 0x395e8083;
                      auVar35._0_8_ = 0x395e8083395e8083;
                      auVar35._12_4_ = 0x395e8083;
                      auVar88 = vfmsub231ps_avx512vl(auVar88,auVar104,auVar35);
                      auVar124._0_4_ = auVar88._0_4_ * auVar88._0_4_;
                      auVar124._4_4_ = auVar88._4_4_ * auVar88._4_4_;
                      auVar124._8_4_ = auVar88._8_4_ * auVar88._8_4_;
                      auVar124._12_4_ = auVar88._12_4_ * auVar88._12_4_;
                      auVar89 = vfmadd213ps_avx512vl(auVar140,auVar88,auVar141);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar88,auVar142);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar88,auVar143);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar88,auVar78);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar88,auVar130);
                      auVar88 = vfmadd213ps_avx512vl(auVar89,auVar124,auVar88);
                      auVar88 = vaddps_avx512vl(auVar88,auVar132);
                      auVar125._0_4_ = (int)auVar104._0_4_;
                      auVar125._4_4_ = (int)auVar104._4_4_;
                      auVar125._8_4_ = (int)auVar104._8_4_;
                      auVar125._12_4_ = (int)auVar104._12_4_;
                      auVar89 = vpslld_avx(auVar125,0x17);
                      auVar89 = vpaddd_avx512vl(auVar89,auVar79);
                      auVar88 = vfmadd213ps_fma(auVar89,auVar88,auVar132);
                      auVar88 = vdivps_avx512vl(auVar132,auVar88);
                      in_ZMM21 = ZEXT1664(auVar88);
                      break;
                    case 4:
                      auVar89 = vminps_avx512vl(auVar88,auVar128);
                      auVar92 = vmaxps_avx(auVar89,auVar129);
                      auVar105 = vfmadd213ps_fma(auVar131,auVar92,auVar130);
                      auVar137._0_4_ = (int)auVar105._0_4_;
                      auVar137._4_4_ = (int)auVar105._4_4_;
                      auVar137._8_4_ = (int)auVar105._8_4_;
                      auVar137._12_4_ = (int)auVar105._12_4_;
                      auVar89 = vcvtdq2ps_avx(auVar137);
                      uVar62 = vcmpps_avx512vl(auVar105,auVar89,1);
                      auVar105 = vsubps_avx512vl(auVar89,auVar132);
                      bVar75 = (bool)((byte)uVar62 & 1);
                      auVar99._0_4_ =
                           (float)((uint)bVar75 * auVar105._0_4_ | (uint)!bVar75 * auVar89._0_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 1) & 1);
                      auVar99._4_4_ =
                           (float)((uint)bVar75 * auVar105._4_4_ | (uint)!bVar75 * auVar89._4_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 2) & 1);
                      auVar99._8_4_ =
                           (float)((uint)bVar75 * auVar105._8_4_ | (uint)!bVar75 * auVar89._8_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 3) & 1);
                      auVar99._12_4_ =
                           (float)((uint)bVar75 * auVar105._12_4_ | (uint)!bVar75 * auVar89._12_4_);
                      auVar89 = vfmsub231ps_fma(auVar92,auVar99,auVar133);
                      auVar89 = vfnmsub231ps_avx512vl(auVar89,auVar99,auVar80);
                      auVar120._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                      auVar120._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                      auVar120._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                      auVar120._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                      auVar92 = vfmadd213ps_avx512vl(auVar140,auVar89,auVar141);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar142);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar143);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar78);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar130);
                      auVar89 = vfmadd213ps_avx512vl(auVar92,auVar120,auVar89);
                      auVar89 = vaddps_avx512vl(auVar89,auVar132);
                      auVar121._0_4_ = (int)auVar99._0_4_;
                      auVar121._4_4_ = (int)auVar99._4_4_;
                      auVar121._8_4_ = (int)auVar99._8_4_;
                      auVar121._12_4_ = (int)auVar99._12_4_;
                      auVar92 = vpslld_avx(auVar121,0x17);
                      auVar92 = vpaddd_avx512vl(auVar92,auVar79);
                      auVar89 = vfmadd213ps_fma(auVar92,auVar89,auVar132);
                      uVar62 = vcmpps_avx512vl(auVar89,(undefined1  [16])0x0,2);
                      auVar27._8_4_ = 0x800000;
                      auVar27._0_8_ = 0x80000000800000;
                      auVar27._12_4_ = 0x800000;
                      auVar89 = vmaxps_avx512vl(auVar89,auVar27);
                      auVar105 = vpsrld_avx(auVar89,0x17);
                      auVar28._8_4_ = 0x807fffff;
                      auVar28._0_8_ = 0x807fffff807fffff;
                      auVar28._12_4_ = 0x807fffff;
                      auVar89 = vpternlogd_avx512vl(auVar89,auVar108,auVar28,0xec);
                      auVar29._8_4_ = 0x3f3504f3;
                      auVar29._0_8_ = 0x3f3504f33f3504f3;
                      auVar29._12_4_ = 0x3f3504f3;
                      uVar12 = vcmpps_avx512vl(auVar89,auVar29,1);
                      auVar30._8_4_ = 0xbf800000;
                      auVar30._0_8_ = 0xbf800000bf800000;
                      auVar30._12_4_ = 0xbf800000;
                      auVar92 = vaddps_avx512vl(auVar89,auVar30);
                      auVar89 = vaddps_avx512vl(auVar92,auVar89);
                      bVar75 = (bool)((byte)uVar12 & 1);
                      auVar100._0_4_ =
                           (float)((uint)bVar75 * auVar89._0_4_ | (uint)!bVar75 * auVar92._0_4_);
                      bVar75 = (bool)((byte)(uVar12 >> 1) & 1);
                      auVar100._4_4_ =
                           (float)((uint)bVar75 * auVar89._4_4_ | (uint)!bVar75 * auVar92._4_4_);
                      bVar75 = (bool)((byte)(uVar12 >> 2) & 1);
                      auVar100._8_4_ =
                           (float)((uint)bVar75 * auVar89._8_4_ | (uint)!bVar75 * auVar92._8_4_);
                      bVar75 = (bool)((byte)(uVar12 >> 3) & 1);
                      auVar100._12_4_ =
                           (float)((uint)bVar75 * auVar89._12_4_ | (uint)!bVar75 * auVar92._12_4_);
                      auVar110._0_4_ = auVar100._0_4_ * auVar100._0_4_;
                      auVar110._4_4_ = auVar100._4_4_ * auVar100._4_4_;
                      auVar110._8_4_ = auVar100._8_4_ * auVar100._8_4_;
                      auVar110._12_4_ = auVar100._12_4_ * auVar100._12_4_;
                      auVar31._8_4_ = 0xbdebd1b8;
                      auVar31._0_8_ = 0xbdebd1b8bdebd1b8;
                      auVar31._12_4_ = 0xbdebd1b8;
                      auVar89 = vfmadd213ps_avx512vl(auVar81,auVar100,auVar31);
                      auVar32._8_4_ = 0x3def251a;
                      auVar32._0_8_ = 0x3def251a3def251a;
                      auVar32._12_4_ = 0x3def251a;
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar100,auVar32);
                      auVar33._8_4_ = 0xbdfe5d4f;
                      auVar33._0_8_ = 0xbdfe5d4fbdfe5d4f;
                      auVar33._12_4_ = 0xbdfe5d4f;
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar100,auVar33);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar100,auVar82);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar100,auVar83);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar100,auVar84);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar100,auVar85);
                      auVar89 = vfmadd213ps_avx512vl(auVar89,auVar100,auVar86);
                      auVar92 = vmulps_avx512vl(auVar110,auVar100);
                      auVar92 = vmulps_avx512vl(auVar92,auVar89);
                      auVar34._8_4_ = 0xffffff82;
                      auVar34._0_8_ = 0xffffff82ffffff82;
                      auVar34._12_4_ = 0xffffff82;
                      auVar89 = vpaddd_avx512vl(auVar105,auVar34);
                      auVar89 = vcvtdq2ps_avx(auVar89);
                      auVar105 = vsubps_avx512vl(auVar89,auVar132);
                      bVar75 = (bool)((byte)uVar12 & 1);
                      auVar101._0_4_ = (uint)bVar75 * auVar105._0_4_ | (uint)!bVar75 * auVar89._0_4_
                      ;
                      bVar75 = (bool)((byte)(uVar12 >> 1) & 1);
                      auVar101._4_4_ = (uint)bVar75 * auVar105._4_4_ | (uint)!bVar75 * auVar89._4_4_
                      ;
                      bVar75 = (bool)((byte)(uVar12 >> 2) & 1);
                      auVar101._8_4_ = (uint)bVar75 * auVar105._8_4_ | (uint)!bVar75 * auVar89._8_4_
                      ;
                      bVar75 = (bool)((byte)(uVar12 >> 3) & 1);
                      auVar101._12_4_ =
                           (uint)bVar75 * auVar105._12_4_ | (uint)!bVar75 * auVar89._12_4_;
                      auVar89 = vfmadd231ps_avx512vl(auVar92,auVar101,auVar80);
                      auVar89 = vfmsub231ps_avx512vl(auVar89,auVar130,auVar110);
                      auVar89 = vsubps_avx512vl(auVar89,auVar100);
                      auVar89 = vfnmadd231ps_fma(auVar89,auVar133,auVar101);
                      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      bVar75 = (bool)((byte)uVar62 & 1);
                      auVar102._0_4_ =
                           (uint)bVar75 * auVar92._0_4_ |
                           (uint)!bVar75 * (int)(auVar89._0_4_ + auVar89._0_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 1) & 1);
                      auVar102._4_4_ =
                           (uint)bVar75 * auVar92._4_4_ |
                           (uint)!bVar75 * (int)(auVar89._4_4_ + auVar89._4_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 2) & 1);
                      auVar102._8_4_ =
                           (uint)bVar75 * auVar92._8_4_ |
                           (uint)!bVar75 * (int)(auVar89._8_4_ + auVar89._8_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 3) & 1);
                      auVar102._12_4_ =
                           (uint)bVar75 * auVar92._12_4_ |
                           (uint)!bVar75 * (int)(auVar89._12_4_ + auVar89._12_4_);
                      auVar89 = vminps_avx(auVar102,auVar128);
                      auVar92 = vmaxps_avx(auVar89,auVar129);
                      auVar105 = vfmadd213ps_fma(auVar131,auVar92,auVar130);
                      auVar138._0_4_ = (int)auVar105._0_4_;
                      auVar138._4_4_ = (int)auVar105._4_4_;
                      auVar138._8_4_ = (int)auVar105._8_4_;
                      auVar138._12_4_ = (int)auVar105._12_4_;
                      auVar89 = vcvtdq2ps_avx(auVar138);
                      uVar62 = vcmpps_avx512vl(auVar105,auVar89,1);
                      auVar105 = vsubps_avx512vl(auVar89,auVar132);
                      bVar75 = (bool)((byte)uVar62 & 1);
                      auVar103._0_4_ =
                           (float)((uint)bVar75 * auVar105._0_4_ | (uint)!bVar75 * auVar89._0_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 1) & 1);
                      auVar103._4_4_ =
                           (float)((uint)bVar75 * auVar105._4_4_ | (uint)!bVar75 * auVar89._4_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 2) & 1);
                      auVar103._8_4_ =
                           (float)((uint)bVar75 * auVar105._8_4_ | (uint)!bVar75 * auVar89._8_4_);
                      bVar75 = (bool)((byte)(uVar62 >> 3) & 1);
                      auVar103._12_4_ =
                           (float)((uint)bVar75 * auVar105._12_4_ | (uint)!bVar75 * auVar89._12_4_);
                      auVar89 = vfmsub231ps_fma(auVar92,auVar103,auVar133);
                      auVar89 = vfnmsub231ps_avx512vl(auVar89,auVar103,auVar80);
                      auVar122._0_4_ = auVar89._0_4_ * auVar89._0_4_;
                      auVar122._4_4_ = auVar89._4_4_ * auVar89._4_4_;
                      auVar122._8_4_ = auVar89._8_4_ * auVar89._8_4_;
                      auVar122._12_4_ = auVar89._12_4_ * auVar89._12_4_;
                      auVar92 = vfmadd213ps_avx512vl(auVar140,auVar89,auVar141);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar142);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar143);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar78);
                      auVar92 = vfmadd213ps_avx512vl(auVar92,auVar89,auVar130);
                      auVar89 = vfmadd213ps_avx512vl(auVar92,auVar122,auVar89);
                      auVar89 = vaddps_avx512vl(auVar89,auVar132);
                      auVar123._0_4_ = (int)auVar103._0_4_;
                      auVar123._4_4_ = (int)auVar103._4_4_;
                      auVar123._8_4_ = (int)auVar103._8_4_;
                      auVar123._12_4_ = (int)auVar103._12_4_;
                      auVar92 = vpslld_avx(auVar123,0x17);
                      auVar92 = vpaddd_avx512vl(auVar92,auVar79);
                      auVar89 = vfmadd213ps_fma(auVar92,auVar89,auVar132);
                      auVar89 = vdivps_avx512vl(auVar87,auVar89);
                      auVar88 = vfmsub231ps_avx512vl(auVar88,auVar88,auVar89);
                      in_ZMM21 = ZEXT1664(auVar88);
                      break;
                    case 5:
                      puVar8 = (undefined4 *)
                               (this->super_ConvolutionDepthWise).activation_params.data;
                      uVar1 = *puVar8;
                      auVar111._4_4_ = uVar1;
                      auVar111._0_4_ = uVar1;
                      auVar111._8_4_ = uVar1;
                      auVar111._12_4_ = uVar1;
                      uVar1 = puVar8[1];
                      auVar26._4_4_ = uVar1;
                      auVar26._0_4_ = uVar1;
                      auVar26._8_4_ = uVar1;
                      auVar26._12_4_ = uVar1;
                      auVar89 = vfmadd213ps_avx512vl(auVar111,auVar88,auVar26);
                      auVar89 = vmaxps_avx(auVar89,(undefined1  [16])0x0);
                      auVar89 = vminps_avx(auVar132,auVar89);
                      auVar88 = vmulps_avx512vl(auVar89,auVar88);
                      in_ZMM21 = ZEXT1664(auVar88);
                    }
                    if (iVar51 < 0x65) {
                      *pauVar69 = in_ZMM20._0_16_;
                      pauVar69[1] = in_ZMM21._0_16_;
                      pauVar69 = pauVar69 + 2;
                    }
                    else {
                      pvVar6 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                      auVar88 = vmulps_avx512vl(in_ZMM20._0_16_,
                                                *(undefined1 (*) [16])
                                                 ((long)pvVar6 + local_2a8 * 0x20));
                      auVar89 = vmulps_avx512vl(in_ZMM21._0_16_,
                                                *(undefined1 (*) [16])
                                                 ((long)pvVar6 + local_2a8 * 0x20 + 0x10));
                      auVar92 = vpternlogd_avx512vl(auVar108,auVar88,auVar107,0xf8);
                      auVar105 = vmovdqa64_avx512vl(auVar108);
                      auVar105 = vpternlogd_avx512vl(auVar105,auVar89,auVar107,0xf8);
                      in_ZMM20 = ZEXT1664(auVar105);
                      auVar89 = vaddps_avx512vl(auVar89,auVar105);
                      auVar112._0_4_ = (int)(auVar92._0_4_ + auVar88._0_4_);
                      auVar112._4_4_ = (int)(auVar92._4_4_ + auVar88._4_4_);
                      auVar112._8_4_ = (int)(auVar92._8_4_ + auVar88._8_4_);
                      auVar112._12_4_ = (int)(auVar92._12_4_ + auVar88._12_4_);
                      auVar126._0_4_ = (int)auVar89._0_4_;
                      auVar126._4_4_ = (int)auVar89._4_4_;
                      auVar126._8_4_ = (int)auVar89._8_4_;
                      auVar126._12_4_ = (int)auVar89._12_4_;
                      auVar88 = vpackssdw_avx(auVar112,auVar126);
                      auVar88 = vpminsw_avx512vl(auVar88,auVar76);
                      auVar88 = vpmaxsw_avx512vl(auVar88,auVar77);
                      auVar88 = vpacksswb_avx(auVar88,auVar88);
                      *(long *)*pauVar70 = auVar88._0_8_;
                      pauVar70 = (undefined1 (*) [16])((long)*pauVar70 + 8);
                    }
                    bVar75 = iVar56 != iVar61;
                    iVar56 = iVar56 + 1;
                  } while (bVar75);
                }
                uVar62 = (ulong)(iVar64 + 1);
              } while (iVar64 != (uint)local_298);
            }
            local_2a8 = local_2a8 + 1;
            local_290 = (ulong)(uint)((int)local_290 + iVar72);
            local_1d8 = uVar58;
          } while (local_2a8 != uVar58);
        }
        if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2f8._0_8_,local_2f8._16_8_ - local_2f8._0_8_);
        }
        iVar56 = 0;
      }
    }
  }
  else {
    iVar61 = (this->super_ConvolutionDepthWise).int8_scale_term;
    local_298 = 1;
    if (opt->use_packing_layout == true) {
      uVar67 = (this->super_ConvolutionDepthWise).num_output;
      if (iVar61 < 0x65) {
        local_298 = (ulong)((uint)((uVar67 & 3) == 0) * 3 + 1);
      }
      else {
        local_298 = 1;
        if ((uVar67 & 7) == 0) {
          local_298 = 8;
        }
      }
    }
    iVar51 = (int)local_298;
    uVar57 = (ulong)(uint)(iVar51 * 4);
    if (100 < iVar61) {
      uVar57 = local_298;
    }
    local_288 = CONCAT44(local_288._4_4_,iVar64);
    Mat::create(top_blob,iVar64,iVar72,(this->super_ConvolutionDepthWise).num_output / iVar51,uVar57
                ,iVar51,opt->blob_allocator);
    OVar48 = _local_2f8;
    iVar56 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_00415f83;
    iVar64 = (this->super_ConvolutionDepthWise).group;
    uVar59 = (int)uVar59 / iVar64;
    uVar67 = (this->super_ConvolutionDepthWise).num_output / iVar64;
    local_2a0 = (_func_int ***)CONCAT44(local_2a0._4_4_,uVar67);
    iVar64 = 1;
    uVar60 = 1;
    if (opt->use_packing_layout == true) {
      iVar64 = 1;
      if ((uVar59 & 7) == 0) {
        iVar64 = 8;
      }
      if (iVar61 < 0x65) {
        uVar60 = (uint)((uVar67 & 3) == 0) * 3 + 1;
      }
      else {
        uVar60 = 1;
        if ((uVar67 & 7) == 0) {
          uVar60 = 8;
        }
      }
    }
    piVar4 = (int *)CONCAT44(local_278.refcount._4_4_,(int)local_278.refcount);
    local_2f8._12_4_ = local_278.refcount._4_4_;
    local_2f8._8_4_ = (int)local_278.refcount;
    local_2f8._0_8_ = local_278.data;
    local_2f8._20_4_ = local_278.elemsize._4_4_;
    local_2f8._16_4_ = (int)local_278.elemsize;
    auStack_2dc = OVar48._28_36_;
    uStack_2e0 = local_278.elempack;
    pAStack_2d8 = local_278.allocator;
    uStack_2d0._4_1_ = (bool)(undefined1)local_278.w;
    uStack_2d0._5_1_ = (bool)local_278.w._1_1_;
    uStack_2d0._6_1_ = (bool)local_278.w._2_1_;
    uStack_2d0._7_1_ = (bool)local_278.w._3_1_;
    uStack_2d0._0_4_ = local_278.dims;
    uStack_2c8._4_1_ = (bool)(undefined1)local_278.d;
    uStack_2c8._5_1_ = (bool)local_278.d._1_1_;
    uStack_2c8._6_1_ = (bool)local_278.d._2_1_;
    uStack_2c8._7_1_ = (bool)local_278.d._3_1_;
    uStack_2c8._0_4_ = local_278.h;
    auStack_2dc._32_4_ = OVar48._60_4_;
    uStack_2c0._0_1_ = (bool)(undefined1)local_278.c;
    uStack_2c0._1_1_ = (bool)local_278.c._1_1_;
    uStack_2c0._2_1_ = (bool)local_278.c._2_1_;
    uStack_2c0._3_1_ = (bool)local_278.c._3_1_;
    local_2b8 = local_278.cstep;
    if (piVar4 != (int *)0x0) {
      LOCK();
      *piVar4 = *piVar4 + 1;
      UNLOCK();
    }
    if (iVar64 < iVar54) {
      local_228.data = *(void **)opt;
      uVar39 = opt->openmp_blocktime;
      uVar40 = opt->use_winograd_convolution;
      uVar42 = opt->use_sgemm_convolution;
      uVar44 = opt->use_int8_inference;
      uVar46 = opt->use_vulkan_compute;
      uVar45 = CONCAT11(uVar46,uVar44);
      uVar43 = CONCAT21(uVar45,uVar42);
      uVar41 = CONCAT31(uVar43,uVar40);
      local_228.allocator = *(Allocator **)&opt->use_bf16_storage;
      local_228._40_8_ = *(undefined8 *)&opt->vulkan_device_index;
      local_228._48_8_ = *(undefined8 *)&opt->flush_denormals;
      local_228.c._0_1_ = opt->use_winograd43_convolution;
      local_228.c._1_1_ = opt->use_winograd63_convolution;
      local_228.c._2_1_ = opt->use_a53_a55_optimized_kernel;
      local_228.c._3_1_ = opt->use_fp16_uniform;
      local_228._60_1_ = opt->use_int8_uniform;
      local_228._61_1_ = opt->use_reserved_9;
      local_228._62_1_ = opt->use_reserved_10;
      local_228._63_1_ = opt->use_reserved_11;
      local_228.elemsize._0_4_ = SUB84(opt->workspace_allocator,0);
      local_228.elemsize._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_228.refcount._0_4_ = SUB84(opt->workspace_allocator,0);
      local_228.refcount._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      local_228.elempack = uVar39;
      local_228._28_4_ = uVar41;
      convert_packing(&local_278,(Mat *)local_2f8,iVar64,(Option *)&local_228);
      if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
        if ((long)(int)uStack_2c0 * local_2b8 != 0) goto LAB_00415139;
      }
      iVar56 = -100;
    }
    else {
LAB_00415139:
      piVar4 = top_blob->refcount;
      local_228.data = top_blob->data;
      local_228.refcount._0_4_ = SUB84(top_blob->refcount,0);
      local_228.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
      local_228.elemsize._0_4_ = (undefined4)top_blob->elemsize;
      local_228.elemsize._4_4_ = (undefined4)(top_blob->elemsize >> 0x20);
      local_228.elempack = top_blob->elempack;
      local_228.allocator = top_blob->allocator;
      local_228.dims = top_blob->dims;
      local_228.w = top_blob->w;
      local_228.h = top_blob->h;
      local_228.d = top_blob->d;
      local_228.c = top_blob->c;
      local_228.cstep = top_blob->cstep;
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + 1;
        UNLOCK();
      }
      if (uVar60 < (uint)local_298) {
        Mat::create(&local_228,(int)local_288,iVar72,
                    (this->super_ConvolutionDepthWise).num_output / (int)uVar60,
                    (ulong)((int)(uVar57 / (local_298 & 0xffffffff)) * uVar60),uVar60,
                    opt->workspace_allocator);
        iVar56 = -100;
        if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0))
        goto LAB_00415215;
      }
      else {
LAB_00415215:
        iVar61 = (this->super_ConvolutionDepthWise).group;
        bVar63 = 0 < iVar61;
        local_280 = CONCAT44(local_280._4_4_,uVar60);
        if (iVar61 < 1) {
          iVar56 = -100;
        }
        else {
          local_288 = CONCAT44(local_288._4_4_,(int)uVar59 / iVar64);
          local_290 = CONCAT44(local_290._4_4_,(int)local_2a0 / (int)uVar60);
          iVar56 = -100;
          iVar61 = 0;
          iVar72 = 0;
          lVar52 = 0;
          do {
            OVar48 = _local_2f8;
            local_2a8 = CONCAT71(local_2a8._1_7_,bVar63);
            local_1c8 = (pointer)((long)(iVar61 / iVar64) * local_2b8 * local_2f8._16_8_ +
                                 local_2f8._0_8_);
            uStack_1c0 = 0;
            uStack_1bc = 0;
            local_1b8 = local_2f8._16_4_;
            uStack_1b4 = local_2f8._20_4_;
            local_1b0 = uStack_2e0;
            local_1a8 = pAStack_2d8;
            local_190 = (int)local_288;
            uVar47 = uStack_2d0;
            uVar13 = uStack_2c8;
            local_188 = ((long)uStack_2c8._4_4_ * local_2f8._16_8_ *
                         (long)(int)uStack_2c8 * (long)uStack_2d0._4_4_ + 0xfU & 0xfffffffffffffff0)
                        / (ulong)local_2f8._16_8_;
            uStack_2d0._0_4_ = (int)uVar47;
            uStack_2d0._4_4_ = SUB84(uVar47,4);
            local_1a0._0_4_ = (int)uStack_2d0;
            local_1a0._4_4_ = uStack_2d0._4_4_;
            uStack_2c8._0_4_ = (int)uVar13;
            uStack_2c8._4_4_ = SUB84(uVar13,4);
            uStack_198._0_4_ = (int)uStack_2c8;
            uStack_198._4_4_ = uStack_2c8._4_4_;
            local_e8 = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
            local_128 = (void *)((long)(iVar72 / (int)(uint)local_280) * local_228.cstep * local_e8
                                + (long)local_228.data);
            uStack_120 = 0;
            uStack_11c = 0;
            local_118 = (undefined4)local_228.elemsize;
            uStack_114 = local_228.elemsize._4_4_;
            local_110 = local_228.elempack;
            local_108 = local_228.allocator;
            local_f0 = (int)local_290;
            local_e8 = ((long)local_228.d * local_e8 * (long)local_228.h * (long)local_228.w + 0xf &
                       0xfffffffffffffff0) / local_e8;
            local_100._0_4_ = local_228.dims;
            local_100._4_4_ = local_228.w;
            uStack_f8._0_4_ = local_228.h;
            uStack_f8._4_4_ = local_228.d;
            pLVar11 = (this->group_ops).
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar52];
            local_78._0_1_ = opt->lightmode;
            local_78._1_1_ = opt->use_shader_pack8;
            local_78._2_1_ = opt->use_subgroup_ops;
            local_78._3_1_ = opt->use_reserved_0;
            local_78._4_4_ = opt->num_threads;
            pAStack_68 = opt->workspace_allocator;
            uStack_60._0_4_ = opt->openmp_blocktime;
            uStack_60._4_1_ = opt->use_winograd_convolution;
            uStack_60._5_1_ = opt->use_sgemm_convolution;
            uStack_60._6_1_ = opt->use_int8_inference;
            uStack_60._7_1_ = opt->use_vulkan_compute;
            uStack_58._0_1_ = opt->use_bf16_storage;
            uStack_58._1_1_ = opt->use_fp16_packed;
            uStack_58._2_1_ = opt->use_fp16_storage;
            uStack_58._3_1_ = opt->use_fp16_arithmetic;
            uStack_58._4_1_ = opt->use_int8_packed;
            uStack_58._5_1_ = opt->use_int8_storage;
            uStack_58._6_1_ = opt->use_int8_arithmetic;
            uStack_58._7_1_ = opt->use_packing_layout;
            uStack_50._0_4_ = opt->vulkan_device_index;
            uStack_50._4_1_ = opt->use_reserved_1;
            uStack_50._5_1_ = opt->use_image_storage;
            uStack_50._6_1_ = opt->use_tensor_storage;
            uStack_50._7_1_ = opt->use_reserved_2;
            uStack_48._0_4_ = opt->flush_denormals;
            uStack_48._4_1_ = opt->use_local_pool_allocator;
            uStack_48._5_1_ = opt->use_shader_local_memory;
            uStack_48._6_1_ = opt->use_cooperative_matrix;
            uStack_48._7_1_ = opt->use_winograd23_convolution;
            uStack_40._0_1_ = opt->use_winograd43_convolution;
            uStack_40._1_1_ = opt->use_winograd63_convolution;
            uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
            uStack_40._3_1_ = opt->use_fp16_uniform;
            uStack_40._4_1_ = opt->use_int8_uniform;
            uStack_40._5_1_ = opt->use_reserved_9;
            uStack_40._6_1_ = opt->use_reserved_10;
            uStack_40._7_1_ = opt->use_reserved_11;
            pAStack_70 = local_228.allocator;
            _local_2f8 = OVar48;
            iVar51 = (*pLVar11->_vptr_Layer[7])(pLVar11,&local_1c8,&local_128,&local_78);
            if (iVar51 != 0) {
              iVar56 = iVar51;
            }
            piVar4 = (int *)CONCAT44(uStack_11c,uStack_120);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_108 == (Allocator *)0x0) {
                  if (local_128 != (void *)0x0) {
                    free(local_128);
                  }
                }
                else {
                  (*local_108->_vptr_Allocator[3])();
                }
              }
            }
            local_e8 = 0;
            local_128 = (void *)0x0;
            uStack_120 = 0;
            uStack_11c = 0;
            local_118 = 0;
            uStack_114 = 0;
            local_110 = 0;
            local_100 = 0;
            uStack_f8 = 0;
            local_f0 = 0;
            piVar4 = (int *)CONCAT44(uStack_1bc,uStack_1c0);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (local_1a8 == (Allocator *)0x0) {
                  if (local_1c8 != (pointer)0x0) {
                    free(local_1c8);
                  }
                }
                else {
                  (*local_1a8->_vptr_Allocator[3])();
                }
              }
            }
            local_188 = 0;
            local_1c8 = (pointer)0x0;
            uStack_1c0 = 0;
            uStack_1bc = 0;
            local_1b8 = 0;
            uStack_1b4 = 0;
            local_1b0 = 0;
            local_1a0 = 0;
            uStack_198 = 0;
            local_190 = 0;
            if (iVar51 != 0) {
              bVar63 = (byte)local_2a8;
              break;
            }
            lVar52 = lVar52 + 1;
            lVar66 = (long)(this->super_ConvolutionDepthWise).group;
            iVar72 = iVar72 + (int)local_2a0;
            iVar61 = iVar61 + uVar59;
            bVar63 = lVar52 < lVar66;
          } while (lVar52 < lVar66);
        }
        if ((bVar63 & 1) == 0) {
          if ((uint)local_280 < (uint)local_298) {
            convert_packing(&local_228,top_blob,(uint)local_298,opt);
            iVar56 = -100;
            if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
            goto LAB_00415ead;
          }
          else if (&local_228 != top_blob) {
            piVar4 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + 1;
              UNLOCK();
            }
            piVar4 = top_blob->refcount;
            if (piVar4 != (int *)0x0) {
              LOCK();
              *piVar4 = *piVar4 + -1;
              UNLOCK();
              if (*piVar4 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (*top_blob->allocator->_vptr_Allocator[3])();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
            *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = local_228.data;
            top_blob->refcount = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
            top_blob->elemsize = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
            top_blob->elempack = local_228.elempack;
            top_blob->allocator = local_228.allocator;
            top_blob->dims = local_228.dims;
            top_blob->w = local_228.w;
            top_blob->h = local_228.h;
            top_blob->d = local_228.d;
            top_blob->c = local_228.c;
            top_blob->cstep = local_228.cstep;
          }
          iVar56 = 0;
        }
      }
LAB_00415ead:
      piVar4 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      if (piVar4 != (int *)0x0) {
        LOCK();
        *piVar4 = *piVar4 + -1;
        UNLOCK();
        if (*piVar4 == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            if (local_228.data != (void *)0x0) {
              free(local_228.data);
            }
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_228.cstep = 0;
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228._56_8_ = local_228._56_8_ & 0xffffffff00000000;
    }
    if ((Allocator *)local_2f8._8_8_ != (Allocator *)0x0) {
      LOCK();
      *(int *)(_func_int ***)local_2f8._8_8_ = *(int *)(_func_int ***)local_2f8._8_8_ + -1;
      UNLOCK();
      if (*(int *)(_func_int ***)local_2f8._8_8_ == 0) {
        if (pAStack_2d8 == (Allocator *)0x0) {
          if ((pointer)local_2f8._0_8_ != (pointer)0x0) {
            free((void *)local_2f8._0_8_);
          }
        }
        else {
          (*pAStack_2d8->_vptr_Allocator[3])();
        }
      }
    }
    auVar49 = auStack_2dc;
    local_2b8 = 0;
    local_2f8._0_16_ = ZEXT816(0);
    _local_2f8 = ZEXT1228(local_2f8._0_12_);
    auStack_2dc._32_4_ = auVar49._32_4_;
    _local_2f8 = ZEXT4060(_local_2f8);
  }
LAB_00415f83:
  piVar4 = (int *)CONCAT44(local_278.refcount._4_4_,(int)local_278.refcount);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_278.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_278.data != (Allocator *)0x0) {
          free(local_278.data);
        }
      }
      else {
        (*(local_278.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_00416004:
  local_278.cstep = 0;
  local_278.c = 0;
  local_278.d = 0;
  local_278.h = 0;
  local_278.w = 0;
  local_278.dims = 0;
  local_278.elempack = 0;
  local_278.elemsize._4_4_ = 0;
  local_278.elemsize._0_4_ = 0;
  local_278.refcount._4_4_ = 0;
  local_278.refcount._0_4_ = 0;
  local_278.data = (void *)0x0;
  piVar4 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if (local_178.data != (void *)0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar56;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}